

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteAliasedRaw
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  uint uVar1;
  uint8 *ptr_00;
  ptrdiff_t pVar2;
  EpsCopyOutputStream *in_RCX;
  uint in_EDX;
  EpsCopyOutputStream *in_RSI;
  EpsCopyOutputStream *in_RDI;
  EpsCopyOutputStream *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe0;
  uint8 *local_8;
  
  ptr_00 = (uint8 *)(long)(int)in_EDX;
  pVar2 = GetSize(in_stack_00000030,(uint8 *)this);
  if ((long)ptr_00 < pVar2) {
    local_8 = WriteRaw(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                       (int)((ulong)in_RCX >> 0x20),ptr_00);
  }
  else {
    local_8 = Trim(in_RCX,ptr_00);
    uVar1 = (*in_RDI->stream_->_vptr_ZeroCopyOutputStream[5])(in_RDI->stream_,in_RSI,(ulong)in_EDX);
    if ((uVar1 & 1) == 0) {
      local_8 = Error(in_RDI);
    }
  }
  return local_8;
}

Assistant:

uint8* EpsCopyOutputStream::WriteAliasedRaw(const void* data, int size,
                                            uint8* ptr) {
  if (size < GetSize(ptr)
  ) {
    return WriteRaw(data, size, ptr);
  } else {
    ptr = Trim(ptr);
    if (stream_->WriteAliasedRaw(data, size)) return ptr;
    return Error();
  }
}